

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O3

istream * operator>>(istream *stream,Msk3Header *header)

{
  int iVar1;
  ulong uVar2;
  Msk3HeaderSwitch h;
  undefined1 auStack_38 [8];
  undefined4 local_30;
  ushort uStack_2c;
  uint16_t uStack_2a;
  uint32_t local_28;
  
  iVar1 = detectSwitch(stream);
  if (iVar1 < 0) {
    header->isSwitch = false;
    std::istream::read((char *)stream,(long)auStack_38);
    uVar2 = CONCAT26(uStack_2a,CONCAT24(uStack_2c,local_30));
    uStack_2a = (uint16_t)((uint)local_30 >> 0x10);
    local_28 = (uint32_t)(uVar2 >> 0x20);
  }
  else {
    header->isSwitch = true;
    std::istream::read((char *)stream,(long)auStack_38);
    uVar2 = (ulong)uStack_2c;
  }
  header->width = (uint16_t)uVar2;
  header->height = uStack_2a;
  header->compressedSize = local_28;
  return stream;
}

Assistant:

std::istream& operator>>(std::istream& stream, Msk3Header& header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		readMsk3<Msk3HeaderPS3>(stream, header);
	} else { // Switch
		readMsk3<Msk3HeaderSwitch>(stream, header);
	}
	return stream;
}